

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file1.cpp
# Opt level: O3

int foobar(int argc,char **argv)

{
  ostream *poVar1;
  char *in_R8;
  string_view delim;
  string file;
  CSVFileInfo info;
  char local_a1;
  string local_a0;
  string local_80;
  undefined1 local_60 [56];
  char local_28;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,argv[1],(allocator<char> *)local_60);
    csv::get_file_info((CSVFileInfo *)local_60,&local_80);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Columns: ",9);
    delim._M_str = in_R8;
    delim._M_len = (size_t)", ";
    csv::internals::format_row
              (&local_a0,(internals *)(local_60 + 0x20),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2,delim);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Dimensions: ",0xc);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," rows x ",8);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," columns",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Delimiter: ",0xb);
    local_a1 = local_28;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_a1,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 0x20));
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," [file]");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int foobar(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string file = argv[1];
    auto info = get_file_info(file);

    std::cout << file << std::endl
        << "Columns: " << internals::format_row(info.col_names, ", ")
        << "Dimensions: " << info.n_rows << " rows x " << info.n_cols << " columns" << std::endl
        << "Delimiter: " << info.delim << std::endl;

    return 0;
}